

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O1

MMDB_entry_data_list_s * test_uint128_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xe9,(pMVar1->entry_data).type,"==",10,"\'uint128\' key\'s value is an uint128",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x101,(pMVar1->entry_data).field_1.int32,"==",0,"uint128 field is 2**120",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_uint128_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UINT128,
           "'uint128' key's value is an uint128");

#if MMDB_UINT128_IS_BYTE_ARRAY
    uint8_t expect[16] = {0x01,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00,
                          0x00};
    ok(memcmp(value->entry_data.uint128, expect, 16) == 0,
       "uint128 field is 2**120");
#else
    mmdb_uint128_t expect = 1;
    expect <<= 120;
    cmp_ok(value->entry_data.uint128, "==", expect, "uint128 field is 2**120");
#endif

    return entry_data_list;
}